

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

void __thiscall Assimp::FIBoolValueImpl::~FIBoolValueImpl(FIBoolValueImpl *this)

{
  ~FIBoolValueImpl(this);
  operator_delete(this);
  return;
}

Assistant:

inline FIBoolValueImpl(std::vector<bool> &&value_): strValueValid(false) { value = std::move(value_); }